

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_Split(SplitForm1 Split)

{
  uint8_t value;
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  Unit_Test::intensityArray(&local_80,3);
  value = *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_40,value,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  Unit_Test::fillImage(&local_40,0,0,local_40._width,local_40._height,&local_80);
  Test_Helper::uniformImages
            ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)&local_68,3,local_40._width,local_40._height);
  (*Split)(&local_40,(Image *)local_68._vptr_ImageTemplate,
           (Image *)((long)local_68._vptr_ImageTemplate + 0x28),
           (Image *)((long)local_68._vptr_ImageTemplate + 0x50));
  bVar1 = Unit_Test::verifyImage
                    ((Image *)local_68._vptr_ImageTemplate,
                     *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    bVar1 = Unit_Test::verifyImage
                      ((Image *)((long)local_68._vptr_ImageTemplate + 0x28),
                       local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[1]);
    if (bVar1) {
      bVar1 = Unit_Test::verifyImage
                        ((Image *)((long)local_68._vptr_ImageTemplate + 0x50),
                         local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[2]);
      goto LAB_001582c8;
    }
  }
  bVar1 = false;
LAB_001582c8:
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)&local_68);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_Split(SplitForm1 Split)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        std::vector < PenguinV_Image::Image > output = uniformImages( 3, input.width(), input.height() );
        Split( input, output[0], output[1], output[2] );

        return verifyImage( output[0], intensity[0] ) && verifyImage( output[1], intensity[1] ) && verifyImage( output[2], intensity[2] );
    }